

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O0

type __thiscall
llvm::make_unique<(anonymous_namespace)::SymlinkTool,llvm::StringRef&>(llvm *this,StringRef *args)

{
  SymlinkTool *this_00;
  StringRef *args_local;
  
  this_00 = (SymlinkTool *)operator_new(0x30);
  anon_unknown.dwarf_26382a::SymlinkTool::Tool(this_00,*args);
  std::
  unique_ptr<(anonymous_namespace)::SymlinkTool,std::default_delete<(anonymous_namespace)::SymlinkTool>>
  ::unique_ptr<std::default_delete<(anonymous_namespace)::SymlinkTool>,void>
            ((unique_ptr<(anonymous_namespace)::SymlinkTool,std::default_delete<(anonymous_namespace)::SymlinkTool>>
              *)this,this_00);
  return (__uniq_ptr_data<(anonymous_namespace)::SymlinkTool,_std::default_delete<(anonymous_namespace)::SymlinkTool>,_true,_true>
          )(__uniq_ptr_data<(anonymous_namespace)::SymlinkTool,_std::default_delete<(anonymous_namespace)::SymlinkTool>,_true,_true>
            )this;
}

Assistant:

typename std::enable_if<!std::is_array<T>::value, std::unique_ptr<T>>::type
make_unique(Args &&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}